

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Release(ShardedLRUCache *this,Handle *handle)

{
  uint uVar1;
  int iVar2;
  Mutex *__mutex;
  
  uVar1 = *(uint *)(handle + 0x40);
  __mutex = &this->shard_[uVar1 >> 0x1c].mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    LRUCache::Unref(this->shard_ + (uVar1 >> 0x1c),(LRUHandle *)handle);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void Release(Handle* handle) override {
    LRUHandle* h = reinterpret_cast<LRUHandle*>(handle);
    shard_[Shard(h->hash)].Release(handle);
  }